

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

LispPTR COM_finish_finfo(LispPTR *args)

{
  DFINFO *pDVar1;
  FINFO *pFVar2;
  finfo *pfVar3;
  int iVar4;
  uint uVar5;
  FINFO *pFVar6;
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 == 0) {
    Lisp_errno = &Dummy_errno;
    uVar5 = *args;
    if ((uVar5 & 0xfff0000) != 0xf0000) {
      if ((uVar5 & 0xfff0000) == 0xe0000) {
        uVar5 = uVar5 & 0xffff;
      }
      else {
        if ((uVar5 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
        }
        uVar5 = *(uint *)(Lisp_world + uVar5);
      }
      if ((-1 < (int)uVar5) && ((int)uVar5 < MAXFINFO)) {
        pDVar1 = FinfoArray + uVar5;
        pFVar2 = FinfoArray[uVar5].head;
        if (pFVar2 != (FINFO *)0x0) {
          pDVar1->head = (FINFO *)0x0;
          pDVar1->next = (FINFO *)0x0;
          pfVar3 = pFVar2;
          do {
            pFVar6 = pfVar3;
            pfVar3 = pFVar6->next;
          } while (pfVar3 != (finfo *)0x0);
          pFVar6->next = FreeFinfoList;
          FreeFinfoList = pFVar2;
          return 0x4c;
        }
        pDVar1->next = (FINFO *)0x0;
      }
    }
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_finish_finfo(LispPTR *args)
{
  DFINFO *dfp;
  FINFO *fp;
  int finfoid;

  ERRSETJMP(NIL);

  Lisp_errno = &Dummy_errno;

  finfoid = LispNumToCInt(args[0]);

  if (finfoid < 0 || MAXFINFO - 1 < finfoid) return (NIL);

  dfp = &FinfoArray[finfoid];
  if ((fp = dfp->head) == (FINFO *)0) {
    dfp->next = (FINFO *)0;
    return (NIL);
  }

  dfp->head = (FINFO *)0;
  dfp->next = (FINFO *)0;
  FreeFinfo(fp);

  return (ATOM_T);
}